

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Access_ghost_element64(int g_a,void *ptr,int64_t *subscript,int64_t *ld)

{
  Integer IVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  Integer _ld [7];
  Integer _subscript [7];
  long alStack_a8 [2];
  Integer aIStack_98 [7];
  long lStack_60;
  Integer local_58 [7];
  
  alStack_a8[1] = 0x18ead2;
  IVar1 = pnga_ndim((long)g_a);
  lVar3 = 0;
  lVar4 = 0;
  if (0 < IVar1) {
    lVar4 = IVar1;
  }
  plVar2 = &lStack_60 + IVar1;
  for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
    *plVar2 = subscript[lVar3] + 1;
    plVar2 = plVar2 + -1;
  }
  lVar3 = 0;
  lVar4 = IVar1 + -1;
  if (IVar1 + -1 < 1) {
    lVar4 = lVar3;
  }
  plVar2 = alStack_a8 + IVar1;
  for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
    *plVar2 = ld[lVar3] + 1;
    plVar2 = plVar2 + -1;
  }
  alStack_a8[1] = 0x18eb40;
  pnga_access_ghost_element_ptr((long)g_a,ptr,local_58,aIStack_98);
  return;
}

Assistant:

void NGA_Access_ghost_element64(int g_a, void *ptr, int64_t subscript[], int64_t ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _subscript[MAXDIM];
     Integer _ld[MAXDIM];

     COPYINDEX_C2F(subscript, _subscript, ndim);
     COPYINDEX_C2F(ld, _ld, ndim-1);
     wnga_access_ghost_element_ptr(a, ptr, _subscript, _ld);
}